

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

CharSetNode * __thiscall
UnifiedRegex::CharSetInner::ClearRange
          (CharSetInner *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x17b,"(level > 0)","level > 0");
    if (!bVar4) goto LAB_00e593be;
    *puVar7 = 0;
  }
  cVar3 = (char)level * '\x04';
  uVar12 = ~(-1 << (cVar3 + 8U & 0x1f));
  if (uVar12 < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x17c,"(h <= lim(level))",
                       "The range for clearing provided is invalid for this level.");
    if (!bVar4) goto LAB_00e593be;
    *puVar7 = 0;
  }
  if (h < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x17d,"(l <= h)","Can\'t clear where lower is bigger than the higher.");
    if (!bVar4) {
LAB_00e593be:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  else if (l == 0) {
    uVar5 = 0;
    if (uVar12 == h) {
      return (CharSetNode *)0x0;
    }
    goto LAB_00e592a2;
  }
  uVar5 = l >> (cVar3 + 4U & 0x1f) & 0xf;
LAB_00e592a2:
  uVar9 = h >> (cVar3 + 4U & 0x1f) & 0xf;
  uVar13 = level - 1;
  uVar12 = ~(-1 << ((char)level * '\x04' + 4U & 0x1f));
  uVar10 = l & uVar12;
  uVar12 = h & uVar12;
  uVar11 = (ulong)uVar5;
  pCVar1 = this->children[uVar11];
  if (uVar5 == uVar9) {
    if (pCVar1 != (CharSetNode *)0x0) {
      iVar6 = (*pCVar1->_vptr_CharSetNode[3])
                        (pCVar1,allocator,(ulong)uVar13,(ulong)uVar10,(ulong)uVar12);
      this->children[uVar11] = (CharSetNode *)CONCAT44(extraout_var,iVar6);
    }
  }
  else {
    if (pCVar1 != (CharSetNode *)0x0) {
      iVar6 = (*pCVar1->_vptr_CharSetNode[3])(pCVar1,allocator,(ulong)uVar13,(ulong)uVar10);
      this->children[uVar11] = (CharSetNode *)CONCAT44(extraout_var_00,iVar6);
    }
    if (uVar5 + 1 < uVar9) {
      do {
        pCVar1 = this->children[uVar11 + 1];
        if (pCVar1 != (CharSetNode *)0x0) {
          (**pCVar1->_vptr_CharSetNode)(pCVar1,allocator);
        }
        this->children[uVar11 + 1] = (CharSetNode *)0x0;
        uVar11 = uVar11 + 1;
      } while ((ulong)uVar9 - 1 != uVar11);
    }
    pCVar1 = this->children[uVar9];
    if (pCVar1 != (CharSetNode *)0x0) {
      iVar6 = (*pCVar1->_vptr_CharSetNode[3])(pCVar1,allocator,(ulong)uVar13,0,(ulong)uVar12);
      this->children[uVar9] = (CharSetNode *)CONCAT44(extraout_var_01,iVar6);
    }
  }
  lVar8 = 1;
  do {
    if (this->children[lVar8 + -1] != (CharSetNode *)0x0) {
      return &this->super_CharSetNode;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x11);
  return (CharSetNode *)0x0;
}

Assistant:

CharSetNode* CharSetInner::ClearRange(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level > 0);
        AssertMsg(h <= lim(level), "The range for clearing provided is invalid for this level.");
        AssertMsg(l <= h, "Can't clear where lower is bigger than the higher.");
        if (l == 0 && h == lim(level))
        {
            return nullptr;
        }

        uint lowerIndex = innerIdx(level, l);
        uint higherIndex = innerIdx(level--, h);
        l = l & lim(level);
        h = h & lim(level);
        if (lowerIndex == higherIndex)
        {
            if (children[lowerIndex] != nullptr)
            {
                children[lowerIndex] = children[lowerIndex]->ClearRange(allocator, level, l, h);
            }
        }
        else
        {
            if (children[lowerIndex] != nullptr)
            {
                children[lowerIndex] = children[lowerIndex]->ClearRange(allocator, level, l, lim(level));
            }

            for (uint i = lowerIndex + 1; i < higherIndex; i++)
            {
                if (children[i] != nullptr)
                {
                    children[i]->FreeSelf(allocator);
                }

                children[i] = nullptr;
            }

            if (children[higherIndex] != nullptr)
            {
                children[higherIndex] = children[higherIndex]->ClearRange(allocator, level, 0, h);
            }
        }
        for (int i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] != nullptr)
            {
                return this;
            }
        }

        return nullptr;
    }